

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2c0f7::ParseDummyNode::configureAttribute
          (ParseDummyNode *this,ConfigureContext *param_1,StringRef name,StringRef value)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_78;
  string local_58;
  ConfigureContext *local_38;
  ConfigureContext *param_1_local;
  ParseDummyNode *this_local;
  StringRef value_local;
  StringRef name_local;
  
  value_local.Data = (char *)value.Length;
  this_local = (ParseDummyNode *)value.Data;
  value_local.Length = (size_t)name.Data;
  local_38 = param_1;
  param_1_local = (ConfigureContext *)this;
  uVar1 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((uVar1 & 1) != 0) {
    llvm::StringRef::str_abi_cxx11_(&local_58,(StringRef *)&value_local.Length);
    uVar2 = std::__cxx11::string::c_str();
    llvm::StringRef::str_abi_cxx11_(&local_78,(StringRef *)&this_local);
    uVar3 = std::__cxx11::string::c_str();
    printf("  -- \'%s\': \'%s\'\n",uVar2,uVar3);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext&, StringRef name,
                                  StringRef value) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': '%s'\n", name.str().c_str(), value.str().c_str());
    }
    return true;
  }